

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5FlushSecureDelete(Fts5Index *p,Fts5Structure *pStruct,char *zTerm,int nTerm,i64 iRowid)

{
  long lVar1;
  int iVar2;
  i64 iVar3;
  undefined4 in_ECX;
  Fts5Index *in_RDX;
  Fts5Index *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  Fts5SegIter *pSeg;
  i64 iThis;
  int rc;
  Fts5Config *pConfig;
  int f;
  sqlite3_stmt *pStmt;
  Fts5Iter *pIter;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff74;
  sqlite3_stmt *in_stack_ffffffffffffff78;
  Fts5Iter *pIter_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  sqlite3_stmt *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffac;
  Fts5Config *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffe8;
  Fts5Iter *pIter_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0x40;
  pIter_01 = (Fts5Iter *)0x0;
  if (in_RDI->pConfig->iVersion != 5) {
    in_stack_ffffffffffffffb0 = in_RDI->pConfig;
    in_stack_ffffffffffffffe8 = 0;
    sqlite3_mprintf("REPLACE INTO %Q.\'%q_config\' VALUES (\'version\', %d)",
                    in_stack_ffffffffffffffb0->zDb,in_stack_ffffffffffffffb0->zName,5);
    fts5IndexPrepareStmt
              ((Fts5Index *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (sqlite3_stmt **)in_stack_ffffffffffffff78,
               (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (in_RDI->rc == 0) {
      sqlite3_step(in_stack_ffffffffffffff98);
      in_stack_ffffffffffffffac = sqlite3_finalize(in_stack_ffffffffffffff78);
      if (in_RDI->rc == 0) {
        in_RDI->rc = in_stack_ffffffffffffffac;
      }
      in_stack_ffffffffffffffb0->iCookie = in_stack_ffffffffffffffb0->iCookie + 1;
      in_stack_ffffffffffffffb0->iVersion = 5;
    }
  }
  pIter_00 = (Fts5Iter *)&stack0xfffffffffffffff0;
  uVar4 = 0;
  fts5MultiIterNew(in_RDX,(Fts5Structure *)CONCAT44(in_ECX,in_stack_ffffffffffffffc8),
                   (int)((ulong)in_R8 >> 0x20),
                   (Fts5Colset *)CONCAT44(uVar5,in_stack_ffffffffffffffb8),
                   (u8 *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,(int)in_RDI,
                   in_stack_ffffffffffffffe8,(Fts5Iter **)pIter_01);
  iVar2 = fts5MultiIterEof(in_RDI,pIter_01);
  if (iVar2 == 0) {
    iVar3 = fts5MultiIterRowid(pIter_01);
    if (iVar3 < in_R8) {
      fts5MultiIterNextFrom
                ((Fts5Index *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),pIter_00
                 ,CONCAT44(in_stack_ffffffffffffff74,uVar4));
    }
    if (((in_RDI->rc == 0) && (iVar2 = fts5MultiIterEof(in_RDI,pIter_01), iVar2 == 0)) &&
       (iVar3 = fts5MultiIterRowid(pIter_01), in_R8 == iVar3)) {
      fts5DoSecureDelete((Fts5Index *)iThis,pSeg);
    }
  }
  fts5MultiIterFree((Fts5Iter *)CONCAT44(in_stack_ffffffffffffff74,uVar4));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI->rc;
}

Assistant:

static int fts5FlushSecureDelete(
  Fts5Index *p,
  Fts5Structure *pStruct,
  const char *zTerm,
  int nTerm,
  i64 iRowid
){
  const int f = FTS5INDEX_QUERY_SKIPHASH;
  Fts5Iter *pIter = 0;            /* Used to find term instance */

  /* If the version number has not been set to SECUREDELETE, do so now. */
  if( p->pConfig->iVersion!=FTS5_CURRENT_VERSION_SECUREDELETE ){
    Fts5Config *pConfig = p->pConfig;
    sqlite3_stmt *pStmt = 0;
    fts5IndexPrepareStmt(p, &pStmt, sqlite3_mprintf(
          "REPLACE INTO %Q.'%q_config' VALUES ('version', %d)",
          pConfig->zDb, pConfig->zName, FTS5_CURRENT_VERSION_SECUREDELETE
    ));
    if( p->rc==SQLITE_OK ){
      int rc;
      sqlite3_step(pStmt);
      rc = sqlite3_finalize(pStmt);
      if( p->rc==SQLITE_OK ) p->rc = rc;
      pConfig->iCookie++;
      pConfig->iVersion = FTS5_CURRENT_VERSION_SECUREDELETE;
    }
  }

  fts5MultiIterNew(p, pStruct, f, 0, (const u8*)zTerm, nTerm, -1, 0, &pIter);
  if( fts5MultiIterEof(p, pIter)==0 ){
    i64 iThis = fts5MultiIterRowid(pIter);
    if( iThis<iRowid ){
      fts5MultiIterNextFrom(p, pIter, iRowid);
    }

    if( p->rc==SQLITE_OK
     && fts5MultiIterEof(p, pIter)==0
     && iRowid==fts5MultiIterRowid(pIter)
    ){
      Fts5SegIter *pSeg = &pIter->aSeg[pIter->aFirst[1].iFirst];
      fts5DoSecureDelete(p, pSeg);
    }
  }

  fts5MultiIterFree(pIter);
  return p->rc;
}